

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

float memory_tree_ns::F1_score_for_two_examples(example *ec1,example *ec2)

{
  size_t sVar1;
  long in_RSI;
  long in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float v2;
  float v1;
  float num_overlaps;
  example *in_stack_ffffffffffffff98;
  example *in_stack_ffffffffffffffa0;
  undefined4 local_4;
  
  fVar2 = get_overlap_from_two_examples(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  dVar5 = (double)fVar2;
  sVar1 = v_array<unsigned_int>::size((v_array<unsigned_int> *)(in_RDI + 0x6828));
  auVar6._8_4_ = (int)(sVar1 >> 0x20);
  auVar6._0_8_ = sVar1;
  auVar6._12_4_ = 0x45300000;
  fVar3 = (float)(dVar5 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) + 1e-07));
  sVar1 = v_array<unsigned_int>::size((v_array<unsigned_int> *)(in_RSI + 0x6828));
  auVar7._8_4_ = (int)(sVar1 >> 0x20);
  auVar7._0_8_ = sVar1;
  auVar7._12_4_ = 0x45300000;
  fVar4 = (float)((double)fVar2 /
                 ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) + 1e-07));
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    local_4 = ((fVar3 * fVar4) / (fVar3 + fVar4)) * 2.0;
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float F1_score_for_two_examples(example& ec1, example& ec2){
        float num_overlaps = get_overlap_from_two_examples(ec1, ec2);
	    float v1 = num_overlaps/(1e-7+ec1.l.multilabels.label_v.size()*1.);
        float v2 = num_overlaps/(1e-7+ec2.l.multilabels.label_v.size()*1.);
        if (num_overlaps == 0.f)
            return 0.f;
        else
	    //return v2; //only precision
            return 2.*(v1*v2/(v1+v2));
    }